

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

void SetPos(GmfMshSct *msh,int64_t pos)

{
  int IntVal;
  int64_t local_10;
  undefined4 local_4;
  
  local_10 = pos;
  if (msh->ver < 3) {
    local_4 = (undefined4)pos;
    RecWrd(msh,&local_4);
  }
  else {
    RecDblWrd(msh,&local_10);
  }
  return;
}

Assistant:

static void SetPos(GmfMshSct *msh, int64_t pos)
{
   int IntVal;

   if(msh->ver >= 3)
      RecDblWrd(msh, (unsigned char*)&pos);
   else
   {
      IntVal = (int)pos;
      RecWrd(msh, (unsigned char*)&IntVal);
   }
}